

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,llama_context *ctx,llama_batch *batch)

{
  byte *pbVar1;
  byte bVar2;
  llama_token token;
  llama_batch *plVar3;
  string *psVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  llama_vocab *vocab;
  ostream *poVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  _Alloc_hider _Var17;
  byte *pbVar18;
  uint uVar19;
  string detokenized;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string __str_4;
  stringstream buf;
  string local_290;
  llama_batch *local_270;
  long *local_268;
  long local_260;
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string *local_1c8;
  llama_context *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = ctx;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  if (0 < batch->n_tokens) {
    bVar6 = true;
    uVar15 = 0;
    local_270 = batch;
    do {
      if (bVar6) {
        bVar6 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      token = batch->token[uVar15];
      uVar9 = llama_get_model(local_1c0);
      vocab = (llama_vocab *)llama_model_get_vocab(uVar9);
      common_token_to_piece_abi_cxx11_(&local_290,vocab,token,true);
      pbVar1 = (byte *)(local_290._M_dataplus._M_p + local_290._M_string_length);
      _Var17._M_p = local_290._M_dataplus._M_p;
      if (0 < (long)local_290._M_string_length >> 2) {
        _Var17._M_p = local_290._M_dataplus._M_p + (local_290._M_string_length & 0xfffffffffffffffc)
        ;
        lVar13 = ((long)local_290._M_string_length >> 2) + 1;
        pbVar14 = (byte *)(local_290._M_dataplus._M_p + 3);
        do {
          iVar7 = isprint((uint)pbVar14[-3]);
          if (iVar7 == 0) {
            pbVar14 = pbVar14 + -3;
            goto LAB_001f7fd8;
          }
          iVar7 = isprint((uint)pbVar14[-2]);
          if (iVar7 == 0) {
            pbVar14 = pbVar14 + -2;
            goto LAB_001f7fd8;
          }
          iVar7 = isprint((uint)pbVar14[-1]);
          if (iVar7 == 0) {
            pbVar14 = pbVar14 + -1;
            goto LAB_001f7fd8;
          }
          iVar7 = isprint((uint)*pbVar14);
          if (iVar7 == 0) goto LAB_001f7fd8;
          lVar13 = lVar13 + -1;
          pbVar14 = pbVar14 + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)pbVar1 - (long)_Var17._M_p;
      if (lVar13 == 1) {
LAB_001f7fb4:
        iVar7 = isprint((uint)(byte)*_Var17._M_p);
        pbVar14 = (byte *)_Var17._M_p;
        if (iVar7 != 0) {
          pbVar14 = pbVar1;
        }
      }
      else if (lVar13 == 2) {
LAB_001f7fa3:
        iVar7 = isprint((uint)(byte)*_Var17._M_p);
        pbVar14 = (byte *)_Var17._M_p;
        if (iVar7 != 0) {
          _Var17._M_p = _Var17._M_p + 1;
          goto LAB_001f7fb4;
        }
      }
      else {
        pbVar14 = pbVar1;
        if ((lVar13 == 3) &&
           (iVar7 = isprint((uint)(byte)*_Var17._M_p), pbVar14 = (byte *)_Var17._M_p, iVar7 != 0)) {
          _Var17._M_p = _Var17._M_p + 1;
          goto LAB_001f7fa3;
        }
      }
LAB_001f7fd8:
      pbVar18 = pbVar14 + 1;
      if (pbVar18 != pbVar1 && pbVar14 != pbVar1) {
        do {
          bVar2 = *pbVar18;
          iVar7 = isprint((uint)bVar2);
          if (iVar7 != 0) {
            *pbVar14 = bVar2;
            pbVar14 = pbVar14 + 1;
          }
          pbVar18 = pbVar18 + 1;
        } while (pbVar18 != pbVar1);
      }
      local_290._M_string_length = (long)pbVar14 - (long)local_290._M_dataplus._M_p;
      *pbVar14 = 0;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      plVar3 = local_270;
      uVar12 = 1;
      if (9 < uVar15) {
        uVar16 = 4;
        uVar11 = uVar15;
        do {
          uVar12 = uVar16;
          uVar19 = (uint)uVar11;
          if (uVar19 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_001f8086;
          }
          if (uVar19 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_001f8086;
          }
          if (uVar19 < 10000) goto LAB_001f8086;
          uVar11 = (uVar11 & 0xffffffff) / 10000;
          uVar16 = uVar12 + 4;
        } while (99999 < uVar19);
        uVar12 = uVar12 + 1;
      }
LAB_001f8086:
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar12);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_208,uVar12,(uint)uVar15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,(char *)local_208,local_200);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", token \'",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", pos ",6);
      uVar12 = plVar3->pos[uVar15];
      uVar16 = -uVar12;
      if (0 < (int)uVar12) {
        uVar16 = uVar12;
      }
      uVar19 = 1;
      if (9 < uVar16) {
        uVar11 = (ulong)uVar16;
        uVar5 = 4;
        do {
          uVar19 = uVar5;
          uVar8 = (uint)uVar11;
          if (uVar8 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_001f8192;
          }
          if (uVar8 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_001f8192;
          }
          if (uVar8 < 10000) goto LAB_001f8192;
          uVar11 = uVar11 / 10000;
          uVar5 = uVar19 + 4;
        } while (99999 < uVar8);
        uVar19 = uVar19 + 1;
      }
LAB_001f8192:
      local_228 = local_218;
      std::__cxx11::string::_M_construct
                ((ulong)&local_228,(char)uVar19 - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_228 + (ulong)(uVar12 >> 0x1f)),uVar19,uVar16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_228,local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", n_seq_id ",0xb);
      uVar12 = plVar3->n_seq_id[uVar15];
      uVar16 = -uVar12;
      if (0 < (int)uVar12) {
        uVar16 = uVar12;
      }
      uVar19 = 1;
      if (9 < uVar16) {
        uVar11 = (ulong)uVar16;
        uVar5 = 4;
        do {
          uVar19 = uVar5;
          uVar8 = (uint)uVar11;
          if (uVar8 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_001f8256;
          }
          if (uVar8 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_001f8256;
          }
          if (uVar8 < 10000) goto LAB_001f8256;
          uVar11 = uVar11 / 10000;
          uVar5 = uVar19 + 4;
        } while (99999 < uVar8);
        uVar19 = uVar19 + 1;
      }
LAB_001f8256:
      local_248 = local_238;
      std::__cxx11::string::_M_construct
                ((ulong)&local_248,(char)uVar19 - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_248 + (ulong)(uVar12 >> 0x1f)),uVar19,uVar16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_248,local_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", seq_id ",9);
      uVar12 = *plVar3->seq_id[uVar15];
      uVar16 = -uVar12;
      if (0 < (int)uVar12) {
        uVar16 = uVar12;
      }
      uVar19 = 1;
      if (9 < uVar16) {
        uVar11 = (ulong)uVar16;
        uVar5 = 4;
        do {
          uVar19 = uVar5;
          uVar8 = (uint)uVar11;
          if (uVar8 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_001f8319;
          }
          if (uVar8 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_001f8319;
          }
          if (uVar8 < 10000) goto LAB_001f8319;
          uVar11 = uVar11 / 10000;
          uVar5 = uVar19 + 4;
        } while (99999 < uVar8);
        uVar19 = uVar19 + 1;
      }
LAB_001f8319:
      local_268 = local_258;
      std::__cxx11::string::_M_construct
                ((ulong)&local_268,(char)uVar19 - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_268 + (ulong)(uVar12 >> 0x1f)),uVar19,uVar16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", logits ",9);
      uVar16 = (uint)plVar3->logits[uVar15];
      uVar12 = -uVar16;
      if (0 < (int)uVar16) {
        uVar12 = uVar16;
      }
      uVar19 = 3 - (uVar12 < 100);
      if (uVar12 < 10) {
        uVar19 = 1;
      }
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1e8,(char)uVar19 - (plVar3->logits[uVar15] >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_1e8 + (ulong)(uVar16 >> 0x1f)),uVar19,uVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_1e8,local_1e0);
      batch = local_270;
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      if (local_268 != local_258) {
        operator_delete(local_268,local_258[0] + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)batch->n_tokens);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
  psVar4 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string string_from(const struct llama_context * ctx, const struct llama_batch & batch) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (int i = 0; i < batch.n_tokens; ++i) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, batch.token[i]);

        detokenized.erase(
                std::remove_if(
                    detokenized.begin(),
                    detokenized.end(),
                    [](const unsigned char c) { return !std::isprint(c); }),
                detokenized.end());

        buf << "\n"          << std::to_string(i)
            << ", token '"   << detokenized << "'"
            << ", pos "      << std::to_string(batch.pos[i])
            << ", n_seq_id " << std::to_string(batch.n_seq_id[i])
            << ", seq_id "   << std::to_string(batch.seq_id[i][0])
            << ", logits "   << std::to_string(batch.logits[i]);
    }

    buf << " ]";

    return buf.str();
}